

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

Mode __thiscall
Catch::Clara::Parser::handlePositional
          (Parser *this,size_t i,char c,string *arg,
          vector<Catch::Clara::Parser::Token,_std::allocator<Catch::Clara::Parser::Token>_> *tokens)

{
  long lVar1;
  string data;
  undefined1 local_78 [8];
  _Alloc_hider local_70;
  undefined4 local_68;
  undefined4 uStack_64;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_60;
  long *local_50;
  long local_48;
  long local_40 [2];
  
  if (this->inQuotes == false) {
    local_68 = 0;
    local_70._M_p = (pointer)0x3;
    local_78 = (undefined1  [8])&local_68;
    lVar1 = std::__cxx11::string::find((char)local_78,(ulong)(uint)(int)c);
    if (local_78 != (undefined1  [8])&local_68) {
      operator_delete((void *)local_78,CONCAT44(uStack_64,local_68) + 1);
    }
    if (lVar1 != -1) {
      std::__cxx11::string::substr((ulong)&local_50,(ulong)arg);
      local_78 = (undefined1  [8])((ulong)local_78 & 0xffffffff00000000);
      local_70._M_p = (pointer)&local_60;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_70,local_50,local_48 + (long)local_50);
      std::vector<Catch::Clara::Parser::Token,_std::allocator<Catch::Clara::Parser::Token>_>::
      emplace_back<Catch::Clara::Parser::Token>(tokens,(Token *)local_78);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_p != &local_60) {
        operator_delete(local_70._M_p,local_60._M_allocated_capacity + 1);
      }
      if (local_50 != local_40) {
        operator_delete(local_50,local_40[0] + 1);
      }
      return None;
    }
  }
  return this->mode;
}

Assistant:

Mode handlePositional( std::size_t i, char c, std::string const& arg, std::vector<Token>& tokens ) {
            if( inQuotes || std::string( "\0", 3 ).find( c ) == std::string::npos )
                return mode;

            std::string data = arg.substr( from, i-from );
            tokens.push_back( Token( Token::Positional, data ) );
            return None;
        }